

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

real_t fastpow2(real_t p)

{
  float fVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  real_t rVar4;
  float local_1c;
  anon_union_4_2_947300a4 v;
  real_t z;
  int w;
  real_t clipp;
  real_t offset;
  real_t p_local;
  
  uVar2 = vcmpss_avx512f(ZEXT416((uint)p),(undefined1  [16])0x0,1);
  local_1c = p;
  if (p < -126.0) {
    local_1c = -126.0;
  }
  fVar1 = (local_1c - (float)(int)local_1c) + (float)((uint)((byte)uVar2 & 1) * 0x3f800000);
  auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbfbebc8d),0),ZEXT416((uint)fVar1),
                           ZEXT416((uint)(local_1c + 121.274055 + 27.728024 / (4.8425255 - fVar1))))
  ;
  rVar4 = (real_t)vcvttss2usi_avx512f(ZEXT416((uint)(auVar3._0_4_ * 8388608.0)));
  return rVar4;
}

Assistant:

static inline real_t fastpow2(real_t p) {
  real_t offset = (p < 0) ? 1.0f : 0.0f;
  real_t clipp = (p < -126) ? -126.0f : p;
  int w = clipp;
  real_t z = clipp - w + offset;
  union { uint32 i; real_t f; } v = {(uint32)
    ((1<<23)*(clipp+121.2740575f+27.7280233f/(4.84252568f-z)-1.49012907f*z))
  };

  return v.f;
}